

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# maph.h
# Opt level: O2

int loadSettings(Settings *s,json *inj,string *fjson)

{
  double dVar1;
  string str;
  string str_00;
  tm *ptVar2;
  bool bVar3;
  __type_conflict _Var4;
  int iVar5;
  Sampling SVar6;
  key_type *pkVar7;
  reference pbVar8;
  undefined8 extraout_RAX;
  undefined8 extraout_RAX_00;
  undefined8 extraout_RAX_01;
  ostream *poVar9;
  time_t tVar10;
  basic_ostream<char,_std::char_traits<char>_> *pbVar11;
  char *pcVar12;
  string *psVar13;
  _Put_time<char> __f;
  _Put_time<char> __f_00;
  undefined8 in_stack_fffffffffffffaf8;
  _Alloc_hider in_stack_fffffffffffffb00;
  size_type in_stack_fffffffffffffb08;
  undefined8 in_stack_fffffffffffffb10;
  undefined8 uStack_4e8;
  undefined8 local_4e0;
  long lStack_4d8;
  char *local_4d0;
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  local_4c8;
  string *local_4b8;
  undefined4 local_4b0;
  uint local_4ac;
  undefined4 local_4a8;
  undefined4 local_4a4;
  tm *local_4a0;
  tm *local_498;
  string *local_490;
  string *local_488;
  time_t *local_480;
  double *local_478;
  string cmapName;
  string mapTypeId;
  string beforeId;
  string afterId;
  string typeId;
  string kernelId;
  string gaussianAmpId;
  string invertMapId;
  string imapId;
  string allCmapsId;
  string cmapNameId;
  string cmapFileId;
  string fgpxId;
  string fnameId;
  string fitnyId;
  string fitnxId;
  string fityId;
  string fitxId;
  string marginId;
  string radiusId;
  string sampleId;
  string verbId;
  string local_1b0;
  string maxyId;
  string maxxId;
  string minyId;
  string minxId;
  string sizeyId;
  string sizexId;
  string local_d0;
  string local_b0;
  string local_90 [32];
  string local_70 [32];
  iterator it;
  
  s->nx = 0x500;
  s->ny = 0x2d0;
  s->verb = 0;
  s->sampling = autosample;
  s->r = 10;
  s->margin = 0.0;
  s->fitx = false;
  s->fity = false;
  s->fitnx = false;
  s->fitny = false;
  s->minx = 0.0;
  s->maxx = 0.0;
  s->miny = 0.0;
  s->maxy = 0.0;
  std::__cxx11::string::find_last_of((char *)fjson,0x1399ed);
  std::__cxx11::string::substr((ulong)&stack0xfffffffffffffb00,(ulong)fjson);
  local_488 = &s->fname;
  std::__cxx11::string::operator=((string *)local_488,(string *)&stack0xfffffffffffffb00);
  std::__cxx11::string::~string((string *)&stack0xfffffffffffffb00);
  local_490 = &s->fgpx;
  std::__cxx11::string::assign((char *)local_490);
  local_4b8 = &s->cmapFile;
  std::__cxx11::string::assign((char *)local_4b8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&cmapName,"",(allocator<char> *)&stack0xfffffffffffffb00);
  s->allCmaps = false;
  s->gka = 10.0;
  s->kernel = cone;
  s->filterType = false;
  s->filterAfter = false;
  s->filterBefore = false;
  s->after = 0;
  s->before = 0;
  s->mapType = heat;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&sizexId,"Image size x",(allocator<char> *)&stack0xfffffffffffffb00);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&sizeyId,"Image size y",(allocator<char> *)&stack0xfffffffffffffb00);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&verbId,"Verbosity",(allocator<char> *)&stack0xfffffffffffffb00);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&sampleId,"Sampling",(allocator<char> *)&stack0xfffffffffffffb00);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&radiusId,"Kernel radius",(allocator<char> *)&stack0xfffffffffffffb00);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&minxId,"Min x",(allocator<char> *)&stack0xfffffffffffffb00);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&minyId,"Min y",(allocator<char> *)&stack0xfffffffffffffb00);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&maxxId,"Max x",(allocator<char> *)&stack0xfffffffffffffb00);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&maxyId,"Max y",(allocator<char> *)&stack0xfffffffffffffb00);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&marginId,"Margin",(allocator<char> *)&stack0xfffffffffffffb00);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&fitxId,"Fit x",(allocator<char> *)&stack0xfffffffffffffb00);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&fityId,"Fit y",(allocator<char> *)&stack0xfffffffffffffb00);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&fitnxId,"Fit nx",(allocator<char> *)&stack0xfffffffffffffb00);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&fitnyId,"Fit ny",(allocator<char> *)&stack0xfffffffffffffb00);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&fnameId,"File name prefix",(allocator<char> *)&stack0xfffffffffffffb00);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&fgpxId,"GPX files",(allocator<char> *)&stack0xfffffffffffffb00);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&cmapFileId,"Colormap file",(allocator<char> *)&stack0xfffffffffffffb00);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&cmapNameId,"Colormap name",(allocator<char> *)&stack0xfffffffffffffb00);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&allCmapsId,"All colormaps",(allocator<char> *)&stack0xfffffffffffffb00);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&imapId,"Color map",(allocator<char> *)&stack0xfffffffffffffb00);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&invertMapId,"Invert color map",(allocator<char> *)&stack0xfffffffffffffb00);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&gaussianAmpId,"Gaussian amplitude",
             (allocator<char> *)&stack0xfffffffffffffb00);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&kernelId,"Kernel",(allocator<char> *)&stack0xfffffffffffffb00);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&typeId,"Type",(allocator<char> *)&stack0xfffffffffffffb00);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&afterId,"After",(allocator<char> *)&stack0xfffffffffffffb00);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&beforeId,"Before",(allocator<char> *)&stack0xfffffffffffffb00);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&mapTypeId,"Map type",(allocator<char> *)&stack0xfffffffffffffb00);
  local_478 = &s->minx;
  local_480 = &s->after;
  nlohmann::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  ::begin(&it,inj);
  local_4a0 = &s->beforetm;
  local_498 = &s->aftertm;
  local_4a8 = 0;
  local_4ac = 0;
  local_4b0 = 0;
  local_4a4 = 0;
  while( true ) {
    nlohmann::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
    ::end((iterator *)&stack0xfffffffffffffb00,inj);
    bVar3 = nlohmann::detail::
            iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
            ::
            operator!=<nlohmann::detail::iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_nullptr>
                      (&it,(iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                            *)&stack0xfffffffffffffb00);
    if (!bVar3) break;
    pkVar7 = nlohmann::detail::
             iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
             ::key(&it);
    _Var4 = std::operator==(pkVar7,&sizexId);
    if (_Var4) {
      pbVar8 = nlohmann::detail::
               iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
               ::operator*(&it);
      if (2 < (byte)(pbVar8->m_type - number_integer)) goto LAB_00107b11;
      pbVar8 = nlohmann::detail::
               iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
               ::operator*(&it);
      iVar5 = nlohmann::
              basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
              ::get_impl<int,_0>(pbVar8);
      s->nx = iVar5;
      goto LAB_00108164;
    }
LAB_00107b11:
    pkVar7 = nlohmann::detail::
             iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
             ::key(&it);
    _Var4 = std::operator==(pkVar7,&sizeyId);
    if (_Var4) {
      pbVar8 = nlohmann::detail::
               iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
               ::operator*(&it);
      if ((byte)(pbVar8->m_type - number_integer) < 3) {
        pbVar8 = nlohmann::detail::
                 iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                 ::operator*(&it);
        iVar5 = nlohmann::
                basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                ::get_impl<int,_0>(pbVar8);
        s->ny = iVar5;
        goto LAB_00108164;
      }
    }
    pkVar7 = nlohmann::detail::
             iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
             ::key(&it);
    _Var4 = std::operator==(pkVar7,&verbId);
    if (_Var4) {
      pbVar8 = nlohmann::detail::
               iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
               ::operator*(&it);
      if ((byte)(pbVar8->m_type - number_integer) < 3) {
        pbVar8 = nlohmann::detail::
                 iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                 ::operator*(&it);
        iVar5 = nlohmann::
                basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                ::get_impl<int,_0>(pbVar8);
        s->verb = iVar5;
        goto LAB_00108164;
      }
    }
    pkVar7 = nlohmann::detail::
             iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
             ::key(&it);
    _Var4 = std::operator==(pkVar7,&sampleId);
    if (_Var4) {
      pbVar8 = nlohmann::detail::
               iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
               ::operator*(&it);
      if (2 < (byte)(pbVar8->m_type - number_integer)) {
        pbVar8 = nlohmann::detail::
                 iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                 ::operator*(&it);
        if (pbVar8->m_type != string) goto LAB_00107c01;
      }
      pbVar8 = nlohmann::detail::
               iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
               ::operator*(&it);
      if ((byte)(pbVar8->m_type - number_integer) < 3) {
        pbVar8 = nlohmann::detail::
                 iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                 ::operator*(&it);
        SVar6 = nlohmann::
                basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                ::get_impl<Sampling,_0>(pbVar8);
        s->sampling = SVar6;
      }
      else {
        pbVar8 = nlohmann::detail::
                 iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                 ::operator*(&it);
        getSamplingName_abi_cxx11_((string *)&stack0xfffffffffffffb00,pointwise);
        nlohmann::
        basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
        ::
        basic_json<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                  (&local_4c8,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &stack0xfffffffffffffb00);
        bVar3 = nlohmann::operator==(pbVar8,&local_4c8);
        nlohmann::
        basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
        ::~basic_json(&local_4c8);
        std::__cxx11::string::~string((string *)&stack0xfffffffffffffb00);
        if (!bVar3) {
          pbVar8 = nlohmann::detail::
                   iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                   ::operator*(&it);
          getSamplingName_abi_cxx11_((string *)&stack0xfffffffffffffb00,linear);
          nlohmann::
          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
          ::
          basic_json<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                    (&local_4c8,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &stack0xfffffffffffffb00);
          bVar3 = nlohmann::operator==(pbVar8,&local_4c8);
          nlohmann::
          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
          ::~basic_json(&local_4c8);
          std::__cxx11::string::~string((string *)&stack0xfffffffffffffb00);
          if (bVar3) {
            s->sampling = linear;
            goto LAB_00108164;
          }
          pbVar8 = nlohmann::detail::
                   iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                   ::operator*(&it);
          getSamplingName_abi_cxx11_((string *)&stack0xfffffffffffffb00,autosample);
          nlohmann::
          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
          ::
          basic_json<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                    (&local_4c8,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &stack0xfffffffffffffb00);
          bVar3 = nlohmann::operator==(pbVar8,&local_4c8);
          nlohmann::
          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
          ::~basic_json(&local_4c8);
          std::__cxx11::string::~string((string *)&stack0xfffffffffffffb00);
          if (bVar3) {
            s->sampling = autosample;
            goto LAB_00108164;
          }
          poVar9 = std::operator<<((ostream *)&std::cout,"\nWarning:  unknown sampling value ");
          pbVar8 = nlohmann::detail::
                   iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                   ::operator*(&it);
          poVar9 = nlohmann::operator<<(poVar9,pbVar8);
          poVar9 = std::operator<<(poVar9,", defaulting to \"");
          getSamplingName_abi_cxx11_((string *)&stack0xfffffffffffffb00,autosample);
          poVar9 = std::operator<<(poVar9,(string *)&stack0xfffffffffffffb00);
          std::operator<<(poVar9,"\"\n");
          goto LAB_0010815c;
        }
        s->sampling = pointwise;
      }
    }
    else {
LAB_00107c01:
      pkVar7 = nlohmann::detail::
               iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
               ::key(&it);
      _Var4 = std::operator==(pkVar7,&radiusId);
      if (_Var4) {
        pbVar8 = nlohmann::detail::
                 iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                 ::operator*(&it);
        if ((byte)(pbVar8->m_type - number_integer) < 3) {
          pbVar8 = nlohmann::detail::
                   iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                   ::operator*(&it);
          iVar5 = nlohmann::
                  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                  ::get_impl<int,_0>(pbVar8);
          s->r = iVar5;
          goto LAB_00108164;
        }
      }
      pkVar7 = nlohmann::detail::
               iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
               ::key(&it);
      _Var4 = std::operator==(pkVar7,&minxId);
      if (_Var4) {
        pbVar8 = nlohmann::detail::
                 iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                 ::operator*(&it);
        if ((byte)(pbVar8->m_type - number_integer) < 3) {
          pbVar8 = nlohmann::detail::
                   iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                   ::operator*(&it);
          dVar1 = nlohmann::
                  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                  ::get_impl<double,_0>(pbVar8);
          *local_478 = dVar1;
          local_4a4 = (undefined4)CONCAT71((int7)((ulong)local_478 >> 8),1);
          goto LAB_00108164;
        }
      }
      pkVar7 = nlohmann::detail::
               iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
               ::key(&it);
      _Var4 = std::operator==(pkVar7,&minyId);
      if (_Var4) {
        pbVar8 = nlohmann::detail::
                 iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                 ::operator*(&it);
        if ((byte)(pbVar8->m_type - number_integer) < 3) {
          pbVar8 = nlohmann::detail::
                   iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                   ::operator*(&it);
          dVar1 = nlohmann::
                  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                  ::get_impl<double,_0>(pbVar8);
          s->miny = dVar1;
          local_4a8 = (undefined4)CONCAT71((int7)((ulong)extraout_RAX >> 8),1);
          goto LAB_00108164;
        }
      }
      pkVar7 = nlohmann::detail::
               iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
               ::key(&it);
      _Var4 = std::operator==(pkVar7,&maxxId);
      if (_Var4) {
        pbVar8 = nlohmann::detail::
                 iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                 ::operator*(&it);
        if ((byte)(pbVar8->m_type - number_integer) < 3) {
          pbVar8 = nlohmann::detail::
                   iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                   ::operator*(&it);
          dVar1 = nlohmann::
                  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                  ::get_impl<double,_0>(pbVar8);
          s->maxx = dVar1;
          local_4ac = (uint)CONCAT71((int7)((ulong)extraout_RAX_00 >> 8),1);
          goto LAB_00108164;
        }
      }
      pkVar7 = nlohmann::detail::
               iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
               ::key(&it);
      _Var4 = std::operator==(pkVar7,&maxyId);
      if (_Var4) {
        pbVar8 = nlohmann::detail::
                 iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                 ::operator*(&it);
        if ((byte)(pbVar8->m_type - number_integer) < 3) {
          pbVar8 = nlohmann::detail::
                   iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                   ::operator*(&it);
          dVar1 = nlohmann::
                  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                  ::get_impl<double,_0>(pbVar8);
          s->maxy = dVar1;
          local_4b0 = (undefined4)CONCAT71((int7)((ulong)extraout_RAX_01 >> 8),1);
          goto LAB_00108164;
        }
      }
      pkVar7 = nlohmann::detail::
               iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
               ::key(&it);
      _Var4 = std::operator==(pkVar7,&marginId);
      if (_Var4) {
        pbVar8 = nlohmann::detail::
                 iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                 ::operator*(&it);
        if ((byte)(pbVar8->m_type - number_integer) < 3) {
          pbVar8 = nlohmann::detail::
                   iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                   ::operator*(&it);
          dVar1 = nlohmann::
                  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                  ::get_impl<double,_0>(pbVar8);
          s->margin = dVar1;
          goto LAB_00108164;
        }
      }
      pkVar7 = nlohmann::detail::
               iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
               ::key(&it);
      _Var4 = std::operator==(pkVar7,&fitxId);
      if (_Var4) {
        pbVar8 = nlohmann::detail::
                 iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                 ::operator*(&it);
        if (pbVar8->m_type == boolean) {
          pbVar8 = nlohmann::detail::
                   iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                   ::operator*(&it);
          bVar3 = nlohmann::
                  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                  ::get_impl<bool,_0>(pbVar8);
          s->fitx = bVar3;
          goto LAB_00108164;
        }
      }
      pkVar7 = nlohmann::detail::
               iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
               ::key(&it);
      _Var4 = std::operator==(pkVar7,&fityId);
      if (_Var4) {
        pbVar8 = nlohmann::detail::
                 iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                 ::operator*(&it);
        if (pbVar8->m_type == boolean) {
          pbVar8 = nlohmann::detail::
                   iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                   ::operator*(&it);
          bVar3 = nlohmann::
                  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                  ::get_impl<bool,_0>(pbVar8);
          s->fity = bVar3;
          goto LAB_00108164;
        }
      }
      pkVar7 = nlohmann::detail::
               iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
               ::key(&it);
      _Var4 = std::operator==(pkVar7,&fitnxId);
      if (_Var4) {
        pbVar8 = nlohmann::detail::
                 iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                 ::operator*(&it);
        if (pbVar8->m_type == boolean) {
          pbVar8 = nlohmann::detail::
                   iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                   ::operator*(&it);
          bVar3 = nlohmann::
                  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                  ::get_impl<bool,_0>(pbVar8);
          s->fitnx = bVar3;
          goto LAB_00108164;
        }
      }
      pkVar7 = nlohmann::detail::
               iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
               ::key(&it);
      _Var4 = std::operator==(pkVar7,&fitnyId);
      if (_Var4) {
        pbVar8 = nlohmann::detail::
                 iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                 ::operator*(&it);
        if (pbVar8->m_type == boolean) {
          pbVar8 = nlohmann::detail::
                   iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                   ::operator*(&it);
          bVar3 = nlohmann::
                  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                  ::get_impl<bool,_0>(pbVar8);
          s->fitny = bVar3;
          goto LAB_00108164;
        }
      }
      pkVar7 = nlohmann::detail::
               iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
               ::key(&it);
      _Var4 = std::operator==(pkVar7,&fnameId);
      if (_Var4) {
        pbVar8 = nlohmann::detail::
                 iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                 ::operator*(&it);
        if (pbVar8->m_type != string) goto LAB_0010801a;
        pbVar8 = nlohmann::detail::
                 iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                 ::operator*(&it);
        nlohmann::
        basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
        ::
        get_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                  ((tm *)&stack0xfffffffffffffb00,pbVar8);
        psVar13 = local_488;
LAB_00108154:
        std::__cxx11::string::operator=((string *)psVar13,(string *)&stack0xfffffffffffffb00);
LAB_0010815c:
        std::__cxx11::string::~string((string *)&stack0xfffffffffffffb00);
      }
      else {
LAB_0010801a:
        pkVar7 = nlohmann::detail::
                 iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                 ::key(&it);
        _Var4 = std::operator==(pkVar7,&fgpxId);
        if (_Var4) {
          pbVar8 = nlohmann::detail::
                   iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                   ::operator*(&it);
          if (pbVar8->m_type == string) {
            pbVar8 = nlohmann::detail::
                     iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                     ::operator*(&it);
            nlohmann::
            basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
            ::
            get_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                      ((tm *)&stack0xfffffffffffffb00,pbVar8);
            psVar13 = local_490;
            goto LAB_00108154;
          }
        }
        pkVar7 = nlohmann::detail::
                 iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                 ::key(&it);
        _Var4 = std::operator==(pkVar7,&cmapFileId);
        if (_Var4) {
          pbVar8 = nlohmann::detail::
                   iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                   ::operator*(&it);
          if (pbVar8->m_type == string) {
            pbVar8 = nlohmann::detail::
                     iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                     ::operator*(&it);
            nlohmann::
            basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
            ::
            get_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                      ((tm *)&stack0xfffffffffffffb00,pbVar8);
            psVar13 = local_4b8;
            goto LAB_00108154;
          }
        }
        pkVar7 = nlohmann::detail::
                 iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                 ::key(&it);
        _Var4 = std::operator==(pkVar7,&cmapNameId);
        if (_Var4) {
          pbVar8 = nlohmann::detail::
                   iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                   ::operator*(&it);
          if (pbVar8->m_type == string) {
            pbVar8 = nlohmann::detail::
                     iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                     ::operator*(&it);
            nlohmann::
            basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
            ::
            get_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                      ((tm *)&stack0xfffffffffffffb00,pbVar8);
            psVar13 = &cmapName;
            goto LAB_00108154;
          }
        }
        pkVar7 = nlohmann::detail::
                 iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                 ::key(&it);
        _Var4 = std::operator==(pkVar7,&imapId);
        if (_Var4) {
          pbVar8 = nlohmann::detail::
                   iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                   ::operator*(&it);
          if ((byte)(pbVar8->m_type - number_integer) < 3) {
            pbVar8 = nlohmann::detail::
                     iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                     ::operator*(&it);
            iVar5 = nlohmann::
                    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                    ::get_impl<int,_0>(pbVar8);
            (s->c).imap = iVar5;
            goto LAB_00108164;
          }
        }
        pkVar7 = nlohmann::detail::
                 iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                 ::key(&it);
        _Var4 = std::operator==(pkVar7,&invertMapId);
        if (_Var4) {
          pbVar8 = nlohmann::detail::
                   iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                   ::operator*(&it);
          if (pbVar8->m_type == boolean) {
            pbVar8 = nlohmann::detail::
                     iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                     ::operator*(&it);
            bVar3 = nlohmann::
                    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                    ::get_impl<bool,_0>(pbVar8);
            (s->c).inv = bVar3;
            goto LAB_00108164;
          }
        }
        pkVar7 = nlohmann::detail::
                 iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                 ::key(&it);
        _Var4 = std::operator==(pkVar7,&allCmapsId);
        if (_Var4) {
          pbVar8 = nlohmann::detail::
                   iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                   ::operator*(&it);
          if (pbVar8->m_type == boolean) {
            pbVar8 = nlohmann::detail::
                     iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                     ::operator*(&it);
            bVar3 = nlohmann::
                    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                    ::get_impl<bool,_0>(pbVar8);
            s->allCmaps = bVar3;
            goto LAB_00108164;
          }
        }
        pkVar7 = nlohmann::detail::
                 iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                 ::key(&it);
        _Var4 = std::operator==(pkVar7,&gaussianAmpId);
        if (_Var4) {
          pbVar8 = nlohmann::detail::
                   iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                   ::operator*(&it);
          if ((byte)(pbVar8->m_type - number_integer) < 3) {
            pbVar8 = nlohmann::detail::
                     iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                     ::operator*(&it);
            dVar1 = nlohmann::
                    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                    ::get_impl<double,_0>(pbVar8);
            s->gka = dVar1;
            goto LAB_00108164;
          }
        }
        pkVar7 = nlohmann::detail::
                 iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                 ::key(&it);
        _Var4 = std::operator==(pkVar7,&kernelId);
        if (_Var4) {
          pbVar8 = nlohmann::detail::
                   iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                   ::operator*(&it);
          if (pbVar8->m_type == string) {
            pbVar8 = nlohmann::detail::
                     iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                     ::operator*(&it);
            getKernelName_abi_cxx11_((string *)&stack0xfffffffffffffb00,pyramid);
            nlohmann::
            basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
            ::
            basic_json<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                      (&local_4c8,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &stack0xfffffffffffffb00);
            bVar3 = nlohmann::operator==(pbVar8,&local_4c8);
            nlohmann::
            basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
            ::~basic_json(&local_4c8);
            std::__cxx11::string::~string((string *)&stack0xfffffffffffffb00);
            if (bVar3) {
              s->kernel = pyramid;
            }
            else {
              pbVar8 = nlohmann::detail::
                       iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                       ::operator*(&it);
              getKernelName_abi_cxx11_((string *)&stack0xfffffffffffffb00,cylinder);
              nlohmann::
              basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
              ::
              basic_json<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                        (&local_4c8,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &stack0xfffffffffffffb00);
              bVar3 = nlohmann::operator==(pbVar8,&local_4c8);
              nlohmann::
              basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
              ::~basic_json(&local_4c8);
              std::__cxx11::string::~string((string *)&stack0xfffffffffffffb00);
              if (bVar3) {
                s->kernel = cylinder;
              }
              else {
                pbVar8 = nlohmann::detail::
                         iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                         ::operator*(&it);
                getKernelName_abi_cxx11_((string *)&stack0xfffffffffffffb00,gaussian);
                nlohmann::
                basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                ::
                basic_json<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                          (&local_4c8,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &stack0xfffffffffffffb00);
                bVar3 = nlohmann::operator==(pbVar8,&local_4c8);
                nlohmann::
                basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                ::~basic_json(&local_4c8);
                std::__cxx11::string::~string((string *)&stack0xfffffffffffffb00);
                if (bVar3) {
                  s->kernel = gaussian;
                }
                else {
                  pbVar8 = nlohmann::detail::
                           iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                           ::operator*(&it);
                  getKernelName_abi_cxx11_((string *)&stack0xfffffffffffffb00,cone);
                  nlohmann::
                  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                  ::
                  basic_json<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                            (&local_4c8,
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             &stack0xfffffffffffffb00);
                  bVar3 = nlohmann::operator==(pbVar8,&local_4c8);
                  nlohmann::
                  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                  ::~basic_json(&local_4c8);
                  std::__cxx11::string::~string((string *)&stack0xfffffffffffffb00);
                  if (!bVar3) {
                    poVar9 = std::operator<<((ostream *)&std::cout,
                                             "\nWarning:  unknown kernel value ");
                    pbVar8 = nlohmann::detail::
                             iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                             ::operator*(&it);
                    poVar9 = nlohmann::operator<<(poVar9,pbVar8);
                    poVar9 = std::operator<<(poVar9,", defaulting to \"");
                    getKernelName_abi_cxx11_((string *)&stack0xfffffffffffffb00,cone);
                    poVar9 = std::operator<<(poVar9,(string *)&stack0xfffffffffffffb00);
                    std::operator<<(poVar9,"\"\n");
                    goto LAB_0010815c;
                  }
                  s->kernel = cone;
                }
              }
            }
            goto LAB_00108164;
          }
        }
        pkVar7 = nlohmann::detail::
                 iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                 ::key(&it);
        _Var4 = std::operator==(pkVar7,&typeId);
        if (_Var4) {
          pbVar8 = nlohmann::detail::
                   iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                   ::operator*(&it);
          if (pbVar8->m_type != string) goto LAB_0010838d;
          s->filterType = true;
          pbVar8 = nlohmann::detail::
                   iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                   ::operator*(&it);
          getTypeName_abi_cxx11_((string *)&stack0xfffffffffffffb00,hike);
          nlohmann::
          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
          ::
          basic_json<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                    (&local_4c8,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &stack0xfffffffffffffb00);
          bVar3 = nlohmann::operator==(pbVar8,&local_4c8);
          nlohmann::
          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
          ::~basic_json(&local_4c8);
          std::__cxx11::string::~string((string *)&stack0xfffffffffffffb00);
          if (bVar3) {
            s->type = hike;
            goto LAB_00108164;
          }
          pbVar8 = nlohmann::detail::
                   iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                   ::operator*(&it);
          getTypeName_abi_cxx11_((string *)&stack0xfffffffffffffb00,nordicSki);
          nlohmann::
          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
          ::
          basic_json<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                    (&local_4c8,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &stack0xfffffffffffffb00);
          bVar3 = nlohmann::operator==(pbVar8,&local_4c8);
          nlohmann::
          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
          ::~basic_json(&local_4c8);
          std::__cxx11::string::~string((string *)&stack0xfffffffffffffb00);
          if (bVar3) {
            s->type = nordicSki;
            goto LAB_00108164;
          }
          pbVar8 = nlohmann::detail::
                   iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                   ::operator*(&it);
          getTypeName_abi_cxx11_((string *)&stack0xfffffffffffffb00,ride);
          nlohmann::
          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
          ::
          basic_json<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                    (&local_4c8,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &stack0xfffffffffffffb00);
          bVar3 = nlohmann::operator==(pbVar8,&local_4c8);
          nlohmann::
          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
          ::~basic_json(&local_4c8);
          std::__cxx11::string::~string((string *)&stack0xfffffffffffffb00);
          if (bVar3) {
            s->type = ride;
            goto LAB_00108164;
          }
          pbVar8 = nlohmann::detail::
                   iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                   ::operator*(&it);
          getTypeName_abi_cxx11_((string *)&stack0xfffffffffffffb00,run);
          nlohmann::
          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
          ::
          basic_json<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                    (&local_4c8,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &stack0xfffffffffffffb00);
          bVar3 = nlohmann::operator==(pbVar8,&local_4c8);
          nlohmann::
          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
          ::~basic_json(&local_4c8);
          std::__cxx11::string::~string((string *)&stack0xfffffffffffffb00);
          if (bVar3) {
            s->type = run;
            goto LAB_00108164;
          }
          pbVar8 = nlohmann::detail::
                   iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                   ::operator*(&it);
          getTypeName_abi_cxx11_((string *)&stack0xfffffffffffffb00,walk);
          nlohmann::
          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
          ::
          basic_json<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                    (&local_4c8,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &stack0xfffffffffffffb00);
          bVar3 = nlohmann::operator==(pbVar8,&local_4c8);
          nlohmann::
          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
          ::~basic_json(&local_4c8);
          std::__cxx11::string::~string((string *)&stack0xfffffffffffffb00);
          if (bVar3) {
            s->type = walk;
            goto LAB_00108164;
          }
          s->filterType = false;
          poVar9 = std::operator<<((ostream *)&std::cout,"\nWarning:  unknown type value ");
          pbVar8 = nlohmann::detail::
                   iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                   ::operator*(&it);
          poVar9 = nlohmann::operator<<(poVar9,pbVar8);
          pcVar12 = ", defaulting to all activity types.\n";
        }
        else {
LAB_0010838d:
          pkVar7 = nlohmann::detail::
                   iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                   ::key(&it);
          _Var4 = std::operator==(pkVar7,&mapTypeId);
          if (_Var4) {
            pbVar8 = nlohmann::detail::
                     iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                     ::operator*(&it);
            if (pbVar8->m_type == string) {
              pbVar8 = nlohmann::detail::
                       iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                       ::operator*(&it);
              getMapTypeName_abi_cxx11_((string *)&stack0xfffffffffffffb00,elevation);
              nlohmann::
              basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
              ::
              basic_json<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                        (&local_4c8,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &stack0xfffffffffffffb00);
              bVar3 = nlohmann::operator==(pbVar8,&local_4c8);
              nlohmann::
              basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
              ::~basic_json(&local_4c8);
              std::__cxx11::string::~string((string *)&stack0xfffffffffffffb00);
              if (bVar3) {
                s->mapType = elevation;
              }
              else {
                pbVar8 = nlohmann::detail::
                         iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                         ::operator*(&it);
                getMapTypeName_abi_cxx11_((string *)&stack0xfffffffffffffb00,gradient);
                nlohmann::
                basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                ::
                basic_json<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                          (&local_4c8,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &stack0xfffffffffffffb00);
                bVar3 = nlohmann::operator==(pbVar8,&local_4c8);
                nlohmann::
                basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                ::~basic_json(&local_4c8);
                std::__cxx11::string::~string((string *)&stack0xfffffffffffffb00);
                if (bVar3) {
                  s->mapType = gradient;
                }
                else {
                  pbVar8 = nlohmann::detail::
                           iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                           ::operator*(&it);
                  getMapTypeName_abi_cxx11_((string *)&stack0xfffffffffffffb00,heat);
                  nlohmann::
                  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                  ::
                  basic_json<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                            (&local_4c8,
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             &stack0xfffffffffffffb00);
                  bVar3 = nlohmann::operator==(pbVar8,&local_4c8);
                  nlohmann::
                  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                  ::~basic_json(&local_4c8);
                  std::__cxx11::string::~string((string *)&stack0xfffffffffffffb00);
                  if (!bVar3) {
                    poVar9 = std::operator<<((ostream *)&std::cout,
                                             "\nWarning:  unknown map type value ");
                    pbVar8 = nlohmann::detail::
                             iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                             ::operator*(&it);
                    poVar9 = nlohmann::operator<<(poVar9,pbVar8);
                    pcVar12 = ", defaulting to heat map.\n";
                    goto LAB_001085a9;
                  }
                  s->mapType = heat;
                }
              }
              goto LAB_00108164;
            }
          }
          pkVar7 = nlohmann::detail::
                   iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                   ::key(&it);
          _Var4 = std::operator==(pkVar7,&afterId);
          if (_Var4) {
            pbVar8 = nlohmann::detail::
                     iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                     ::operator*(&it);
            if (pbVar8->m_type == string) {
              s->filterAfter = true;
              pbVar8 = nlohmann::detail::
                       iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                       ::operator*(&it);
              nlohmann::
              basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
              ::
              get_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                        (local_70,pbVar8);
              str._M_string_length = (size_type)in_stack_fffffffffffffb00._M_p;
              str._M_dataplus._M_p = (pointer)in_stack_fffffffffffffaf8;
              str.field_2._M_allocated_capacity = in_stack_fffffffffffffb08;
              str.field_2._8_8_ = in_stack_fffffffffffffb10;
              str2tm((tm *)&stack0xfffffffffffffb00,str);
              ptVar2 = local_498;
              local_498->tm_zone = local_4d0;
              *(undefined8 *)&local_498->tm_isdst = local_4e0;
              local_498->tm_gmtoff = lStack_4d8;
              *(undefined8 *)&local_498->tm_mon = in_stack_fffffffffffffb10;
              *(undefined8 *)&local_498->tm_wday = uStack_4e8;
              *(pointer *)local_498 = in_stack_fffffffffffffb00._M_p;
              *(size_type *)&local_498->tm_hour = in_stack_fffffffffffffb08;
              std::__cxx11::string::~string(local_70);
              tVar10 = mktime((tm *)ptVar2);
              *local_480 = tVar10;
              goto LAB_00108164;
            }
          }
          pkVar7 = nlohmann::detail::
                   iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                   ::key(&it);
          _Var4 = std::operator==(pkVar7,&beforeId);
          if (_Var4) {
            pbVar8 = nlohmann::detail::
                     iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                     ::operator*(&it);
            if (pbVar8->m_type == string) {
              s->filterBefore = true;
              pbVar8 = nlohmann::detail::
                       iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                       ::operator*(&it);
              nlohmann::
              basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
              ::
              get_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                        (local_90,pbVar8);
              str_00._M_string_length = (size_type)in_stack_fffffffffffffb00._M_p;
              str_00._M_dataplus._M_p = (pointer)in_stack_fffffffffffffaf8;
              str_00.field_2._M_allocated_capacity = in_stack_fffffffffffffb08;
              str_00.field_2._8_8_ = in_stack_fffffffffffffb10;
              str2tm((tm *)&stack0xfffffffffffffb00,str_00);
              ptVar2 = local_4a0;
              local_4a0->tm_zone = local_4d0;
              *(undefined8 *)&local_4a0->tm_isdst = local_4e0;
              local_4a0->tm_gmtoff = lStack_4d8;
              *(undefined8 *)&local_4a0->tm_mon = in_stack_fffffffffffffb10;
              *(undefined8 *)&local_4a0->tm_wday = uStack_4e8;
              *(pointer *)local_4a0 = in_stack_fffffffffffffb00._M_p;
              *(size_type *)&local_4a0->tm_hour = in_stack_fffffffffffffb08;
              std::__cxx11::string::~string(local_90);
              tVar10 = mktime((tm *)ptVar2);
              s->before = tVar10;
              goto LAB_00108164;
            }
          }
          poVar9 = std::operator<<((ostream *)&std::cout,"\nWarning:  unknown JSON key \"");
          pkVar7 = nlohmann::detail::
                   iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                   ::key(&it);
          poVar9 = std::operator<<(poVar9,(string *)pkVar7);
          poVar9 = std::operator<<(poVar9,"\" with value \"");
          pbVar8 = nlohmann::detail::
                   iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                   ::operator*(&it);
          poVar9 = nlohmann::operator<<(poVar9,pbVar8);
          pcVar12 = "\"\n";
        }
LAB_001085a9:
        std::operator<<(poVar9,pcVar12);
      }
    }
LAB_00108164:
    nlohmann::detail::
    iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
    ::operator++(&it);
  }
  bVar3 = (bool)(~(byte)local_4b0 & 1);
  if ((local_4ac & 1) == 0) {
    bVar3 = true;
  }
  if (((byte)local_4a4 & (byte)local_4a8 & 1) == 0) {
    bVar3 = true;
  }
  s->fit = bVar3;
  if (s->mapType != heat) {
    s->sampling = linear;
    s->kernel = cylinder;
  }
  std::operator<<((ostream *)&std::cout,"\n");
  poVar9 = std::operator<<((ostream *)&std::cout,"Image size");
  poVar9 = std::operator<<(poVar9," = ");
  poVar9 = (ostream *)std::ostream::operator<<((ostream *)poVar9,s->nx);
  poVar9 = std::operator<<(poVar9,", ");
  poVar9 = (ostream *)std::ostream::operator<<((ostream *)poVar9,s->ny);
  std::operator<<(poVar9,"\n");
  poVar9 = std::operator<<((ostream *)&std::cout,(string *)&fnameId);
  poVar9 = std::operator<<(poVar9," = \"");
  poVar9 = std::operator<<(poVar9,(string *)local_488);
  std::operator<<(poVar9,"\"\n");
  poVar9 = std::operator<<((ostream *)&std::cout,(string *)&fgpxId);
  poVar9 = std::operator<<(poVar9," = \"");
  poVar9 = std::operator<<(poVar9,(string *)local_490);
  std::operator<<(poVar9,"\"\n");
  poVar9 = std::operator<<((ostream *)&std::cout,(string *)&cmapFileId);
  poVar9 = std::operator<<(poVar9," = \"");
  poVar9 = std::operator<<(poVar9,(string *)local_4b8);
  std::operator<<(poVar9,"\"\n");
  poVar9 = std::operator<<((ostream *)&std::cout,(string *)&cmapNameId);
  poVar9 = std::operator<<(poVar9," = \"");
  poVar9 = std::operator<<(poVar9,(string *)&cmapName);
  std::operator<<(poVar9,"\"\n");
  poVar9 = std::operator<<((ostream *)&std::cout,(string *)&allCmapsId);
  poVar9 = std::operator<<(poVar9," = \"");
  poVar9 = std::ostream::_M_insert<bool>(SUB81(poVar9,0));
  std::operator<<(poVar9,"\"\n");
  poVar9 = std::operator<<((ostream *)&std::cout,(string *)&imapId);
  poVar9 = std::operator<<(poVar9," = ");
  poVar9 = (ostream *)std::ostream::operator<<((ostream *)poVar9,(s->c).imap);
  std::operator<<(poVar9,"\n");
  poVar9 = std::operator<<((ostream *)&std::cout,(string *)&invertMapId);
  poVar9 = std::operator<<(poVar9," = ");
  poVar9 = std::ostream::_M_insert<bool>(SUB81(poVar9,0));
  std::operator<<(poVar9,"\n");
  poVar9 = std::operator<<((ostream *)&std::cout,(string *)&verbId);
  poVar9 = std::operator<<(poVar9," = ");
  poVar9 = (ostream *)std::ostream::operator<<((ostream *)poVar9,s->verb);
  std::operator<<(poVar9,"\n");
  poVar9 = std::operator<<((ostream *)&std::cout,(string *)&sampleId);
  poVar9 = std::operator<<(poVar9," = ");
  getSamplingName_abi_cxx11_((string *)&stack0xfffffffffffffb00,s->sampling);
  poVar9 = std::operator<<(poVar9,(string *)&stack0xfffffffffffffb00);
  std::operator<<(poVar9,"\n");
  std::__cxx11::string::~string((string *)&stack0xfffffffffffffb00);
  poVar9 = std::operator<<((ostream *)&std::cout,(string *)&radiusId);
  poVar9 = std::operator<<(poVar9," = ");
  poVar9 = (ostream *)std::ostream::operator<<((ostream *)poVar9,s->r);
  std::operator<<(poVar9,"\n");
  poVar9 = std::operator<<((ostream *)&std::cout,(string *)&gaussianAmpId);
  std::operator<<(poVar9," = ");
  poVar9 = std::ostream::_M_insert<double>(s->gka);
  std::operator<<(poVar9,"\n");
  poVar9 = std::operator<<((ostream *)&std::cout,(string *)&kernelId);
  poVar9 = std::operator<<(poVar9," = ");
  getKernelName_abi_cxx11_((string *)&stack0xfffffffffffffb00,s->kernel);
  poVar9 = std::operator<<(poVar9,(string *)&stack0xfffffffffffffb00);
  std::operator<<(poVar9,"\n");
  std::__cxx11::string::~string((string *)&stack0xfffffffffffffb00);
  poVar9 = std::operator<<((ostream *)&std::cout,(string *)&marginId);
  std::operator<<(poVar9," = ");
  poVar9 = std::ostream::_M_insert<double>(s->margin);
  std::operator<<(poVar9,"\n");
  poVar9 = std::operator<<((ostream *)&std::cout,(string *)&fitxId);
  poVar9 = std::operator<<(poVar9," = ");
  poVar9 = std::ostream::_M_insert<bool>(SUB81(poVar9,0));
  std::operator<<(poVar9,"\n");
  poVar9 = std::operator<<((ostream *)&std::cout,(string *)&fityId);
  poVar9 = std::operator<<(poVar9," = ");
  poVar9 = std::ostream::_M_insert<bool>(SUB81(poVar9,0));
  std::operator<<(poVar9,"\n");
  poVar9 = std::operator<<((ostream *)&std::cout,(string *)&fitnxId);
  poVar9 = std::operator<<(poVar9," = ");
  poVar9 = std::ostream::_M_insert<bool>(SUB81(poVar9,0));
  std::operator<<(poVar9,"\n");
  poVar9 = std::operator<<((ostream *)&std::cout,(string *)&fitnyId);
  poVar9 = std::operator<<(poVar9," = ");
  poVar9 = std::ostream::_M_insert<bool>(SUB81(poVar9,0));
  std::operator<<(poVar9,"\n");
  poVar9 = std::operator<<((ostream *)&std::cout,(string *)&mapTypeId);
  poVar9 = std::operator<<(poVar9," = ");
  getMapTypeName_abi_cxx11_((string *)&stack0xfffffffffffffb00,s->mapType);
  poVar9 = std::operator<<(poVar9,(string *)&stack0xfffffffffffffb00);
  std::operator<<(poVar9,"\n");
  std::__cxx11::string::~string((string *)&stack0xfffffffffffffb00);
  if (s->filterType == true) {
    poVar9 = std::operator<<((ostream *)&std::cout,(string *)&typeId);
    poVar9 = std::operator<<(poVar9," = ");
    getTypeName_abi_cxx11_((string *)&stack0xfffffffffffffb00,s->type);
    poVar9 = std::operator<<(poVar9,(string *)&stack0xfffffffffffffb00);
    std::operator<<(poVar9,"\n");
    std::__cxx11::string::~string((string *)&stack0xfffffffffffffb00);
  }
  if (s->filterAfter == true) {
    poVar9 = std::operator<<((ostream *)&std::cout,(string *)&afterId);
    poVar9 = std::operator<<(poVar9," = ");
    __f._M_fmt = "%c";
    __f._M_tmb = local_498;
    pbVar11 = std::operator<<(poVar9,__f);
    std::operator<<(pbVar11,"\n");
  }
  if (s->filterBefore == true) {
    poVar9 = std::operator<<((ostream *)&std::cout,(string *)&beforeId);
    poVar9 = std::operator<<(poVar9," = ");
    __f_00._M_fmt = "%c";
    __f_00._M_tmb = local_4a0;
    pbVar11 = std::operator<<(poVar9,__f_00);
    std::operator<<(pbVar11,"\n");
  }
  if (s->fit == false) {
    printBounds(s);
  }
  std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
  bVar3 = std::operator!=(local_4b8,"");
  if (bVar3) {
    bVar3 = std::operator!=(&cmapName,"");
    if (bVar3) {
      if ((s->allCmaps & 1U) == 0) {
        std::__cxx11::string::string((string *)&local_d0,(string *)local_4b8);
        std::__cxx11::string::string((string *)&local_1b0,(string *)&cmapName);
        psVar13 = &local_d0;
        iVar5 = irwincolor::Map::load(&s->c,psVar13,&local_1b0);
        std::__cxx11::string::~string((string *)&local_1b0);
      }
      else {
LAB_001090d4:
        psVar13 = &local_b0;
        std::__cxx11::string::string((string *)psVar13,(string *)local_4b8);
        iVar5 = irwincolor::loadMapNames(psVar13,&s->mapNames);
      }
      std::__cxx11::string::~string((string *)psVar13);
      if (iVar5 != 0) goto LAB_0010910b;
    }
    else if ((s->allCmaps & 1U) != 0) goto LAB_001090d4;
  }
  iVar5 = 0;
LAB_0010910b:
  std::__cxx11::string::~string((string *)&mapTypeId);
  std::__cxx11::string::~string((string *)&beforeId);
  std::__cxx11::string::~string((string *)&afterId);
  std::__cxx11::string::~string((string *)&typeId);
  std::__cxx11::string::~string((string *)&kernelId);
  std::__cxx11::string::~string((string *)&gaussianAmpId);
  std::__cxx11::string::~string((string *)&invertMapId);
  std::__cxx11::string::~string((string *)&imapId);
  std::__cxx11::string::~string((string *)&allCmapsId);
  std::__cxx11::string::~string((string *)&cmapNameId);
  std::__cxx11::string::~string((string *)&cmapFileId);
  std::__cxx11::string::~string((string *)&fgpxId);
  std::__cxx11::string::~string((string *)&fnameId);
  std::__cxx11::string::~string((string *)&fitnyId);
  std::__cxx11::string::~string((string *)&fitnxId);
  std::__cxx11::string::~string((string *)&fityId);
  std::__cxx11::string::~string((string *)&fitxId);
  std::__cxx11::string::~string((string *)&marginId);
  std::__cxx11::string::~string((string *)&maxyId);
  std::__cxx11::string::~string((string *)&maxxId);
  std::__cxx11::string::~string((string *)&minyId);
  std::__cxx11::string::~string((string *)&minxId);
  std::__cxx11::string::~string((string *)&radiusId);
  std::__cxx11::string::~string((string *)&sampleId);
  std::__cxx11::string::~string((string *)&verbId);
  std::__cxx11::string::~string((string *)&sizeyId);
  std::__cxx11::string::~string((string *)&sizexId);
  std::__cxx11::string::~string((string *)&cmapName);
  return iVar5;
}

Assistant:

int loadSettings(Settings& s, json& inj, std::string& fjson)
{
	// Initial defaults
	s.nx = 1280;
	s.ny = 720;
	s.verb = 0;
	s.sampling = autosample;
	s.r = 10;
	s.minx = 0.0;
	s.miny = 0.0;
	s.maxx = 0.0;
	s.maxy = 0.0;
	s.margin = 0.0;
	s.fitx = false;
	s.fity = false;
	s.fitnx = false;
	s.fitny = false;
	s.fname = fjson.substr(0, fjson.find_last_of("."));
	s.fgpx = "*.gpx";
	s.cmapFile = "";
	std::string cmapName = "";
	s.allCmaps = false;
	s.gka = 10.0;
	s.kernel = cone;
	s.filterType = false;
	s.filterAfter = false;
	s.after = 0;
	s.filterBefore = false;
	s.before = 0;
	s.mapType = heat;

	bool bminx = false, bminy = false, bmaxx = false, bmaxy = false;

	// JSON keys
	const std::string sizexId = "Image size x";
	const std::string sizeyId = "Image size y";
	const std::string verbId = "Verbosity";
	const std::string sampleId = "Sampling";
	const std::string radiusId = "Kernel radius";
	const std::string minxId = "Min x";
	const std::string minyId = "Min y";
	const std::string maxxId = "Max x";
	const std::string maxyId = "Max y";
	const std::string marginId = "Margin";
	const std::string fitxId = "Fit x";
	const std::string fityId = "Fit y";
	const std::string fitnxId = "Fit nx";
	const std::string fitnyId = "Fit ny";
	const std::string fnameId = "File name prefix";
	const std::string fgpxId = "GPX files";
	const std::string cmapFileId = "Colormap file";
	const std::string cmapNameId = "Colormap name";
	const std::string allCmapsId = "All colormaps";
	const std::string imapId = "Color map";
	const std::string invertMapId = "Invert color map";
	const std::string gaussianAmpId = "Gaussian amplitude";
	const std::string kernelId = "Kernel";
	const std::string typeId = "Type";
	const std::string afterId = "After";
	const std::string beforeId = "Before";
	const std::string mapTypeId = "Map type";

	for (json::iterator it = inj.begin(); it != inj.end(); it++)
	{
		//std::cout << "\nkey = " << it.key();
		if (it.key() == sizexId && it.value().is_number())
		{
			s.nx = it.value();
		}
		else if (it.key() == sizeyId && it.value().is_number())
		{
			s.ny = it.value();
		}
		else if (it.key() == verbId && it.value().is_number())
		{
			s.verb = it.value();
		}
		else if (it.key() == sampleId
				&& (it.value().is_number() || it.value().is_string()))
		{
			if (it.value().is_number())
				s.sampling = it.value();
			else
			{
				if (it.value() == getSamplingName(pointwise))
					s.sampling = pointwise;
				else if (it.value() == getSamplingName(linear))
					s.sampling = linear;
				else if (it.value() == getSamplingName(autosample))
					s.sampling = autosample;
				else
					std::cout << "\nWarning:  unknown sampling value "
							<< it.value() << ", defaulting to \""
							<< getSamplingName(autosample) << "\"\n";
			}
		}
		else if (it.key() == radiusId && it.value().is_number())
		{
			s.r = it.value();
		}
		else if (it.key() == minxId && it.value().is_number())
		{
			s.minx = it.value();
			bminx = true;
		}
		else if (it.key() == minyId && it.value().is_number())
		{
			s.miny = it.value();
			bminy = true;
		}
		else if (it.key() == maxxId && it.value().is_number())
		{
			s.maxx = it.value();
			bmaxx = true;
		}
		else if (it.key() == maxyId && it.value().is_number())
		{
			s.maxy = it.value();
			bmaxy = true;
		}
		else if (it.key() == marginId && it.value().is_number())
		{
			s.margin = it.value();
		}
		else if (it.key() == fitxId && it.value().is_boolean())
		{
			s.fitx = it.value();
		}
		else if (it.key() == fityId && it.value().is_boolean())
		{
			s.fity = it.value();
		}
		else if (it.key() == fitnxId && it.value().is_boolean())
		{
			s.fitnx = it.value();
		}
		else if (it.key() == fitnyId && it.value().is_boolean())
		{
			s.fitny = it.value();
		}
		else if (it.key() == fnameId && it.value().is_string())
		{
			s.fname = it.value();
		}
		else if (it.key() == fgpxId && it.value().is_string())
		{
			s.fgpx = it.value();
		}
		else if (it.key() == cmapFileId && it.value().is_string())
		{
			s.cmapFile = it.value();
		}
		else if (it.key() == cmapNameId && it.value().is_string())
		{
			cmapName = it.value();
		}
		else if (it.key() == imapId && it.value().is_number())
		{
			s.c.imap = it.value();
		}
		else if (it.key() == invertMapId && it.value().is_boolean())
		{
			s.c.inv = it.value();
		}
		else if (it.key() == allCmapsId && it.value().is_boolean())
		{
			s.allCmaps = it.value();
		}
		else if (it.key() == gaussianAmpId && it.value().is_number())
		{
			s.gka = it.value();
		}
		else if (it.key() == kernelId && it.value().is_string())
		{
			if (it.value() == getKernelName(pyramid))
				s.kernel = pyramid;
			else if (it.value() == getKernelName(cylinder))
				s.kernel = cylinder;
			else if (it.value() == getKernelName(gaussian))
				s.kernel = gaussian;
			else if (it.value() == getKernelName(cone))
				s.kernel = cone;
			else
				std::cout << "\nWarning:  unknown kernel value "
						<< it.value() << ", defaulting to \""
						<< getKernelName(cone) << "\"\n";
		}
		else if (it.key() == typeId && it.value().is_string())
		{
			s.filterType = true;
			if (it.value() == getTypeName(hike))
				s.type = hike;
			else if (it.value() == getTypeName(nordicSki))
				s.type = nordicSki;
			else if (it.value() == getTypeName(ride))
				s.type = ride;
			else if (it.value() == getTypeName(run))
				s.type = run;
			else if (it.value() == getTypeName(walk))
				s.type = walk;
			else
			{
				s.filterType = false;
				std::cout << "\nWarning:  unknown type value "
						<< it.value() << ", defaulting to all activity types.\n";
			}
		}
		else if (it.key() == mapTypeId && it.value().is_string())
		{
			if (it.value() == getMapTypeName(elevation))
				s.mapType = elevation;
			else if (it.value() == getMapTypeName(gradient))
				s.mapType = gradient;
			else if (it.value() == getMapTypeName(heat))
				s.mapType = heat;
			else
			{
				std::cout << "\nWarning:  unknown map type value "
						<< it.value() << ", defaulting to heat map.\n";
			}
		}
		else if (it.key() == afterId && it.value().is_string())
		{
			s.filterAfter = true;
			s.aftertm = str2tm((std::string) it.value());
			s.after = mktime(&s.aftertm);
		}
		else if (it.key() == beforeId && it.value().is_string())
		{
			s.filterBefore = true;
			s.beforetm = str2tm((std::string) it.value());
			s.before = mktime(&s.beforetm);
		}
		else
		{
			std::cout << "\nWarning:  unknown JSON key \"" << it.key()
					<< "\" with value \"" << it.value() << "\"\n";
		}
	}

	s.fit = !(bminx && bminy && bmaxx && bmaxy);

	if (s.mapType != heat)
	{
		// Linear sampling, cylinder kernel only for non-heat maps
		s.sampling = linear;
		s.kernel = cylinder;
	}

	// Echo inputs
	std::cout << "\n";
	std::cout << "Image size" << " = " << s.nx << ", " << s.ny << "\n";
	std::cout << fnameId << " = \"" << s.fname << "\"\n";
	std::cout << fgpxId << " = \"" << s.fgpx << "\"\n";
	std::cout << cmapFileId << " = \"" << s.cmapFile << "\"\n";
	std::cout << cmapNameId << " = \"" << cmapName << "\"\n";
	std::cout << allCmapsId << " = \"" << s.allCmaps << "\"\n";
	std::cout << imapId << " = " << s.c.imap << "\n";
	std::cout << invertMapId << " = " << s.c.inv << "\n";
	std::cout << verbId << " = " << s.verb << "\n";
	std::cout << sampleId << " = " << getSamplingName(s.sampling) << "\n";
	std::cout << radiusId << " = " << s.r << "\n";
	std::cout << gaussianAmpId << " = " << s.gka << "\n";
	std::cout << kernelId << " = " << getKernelName(s.kernel) << "\n";
	std::cout << marginId << " = " << s.margin << "\n";
	std::cout << fitxId << " = " << s.fitx << "\n";
	std::cout << fityId << " = " << s.fity << "\n";
	std::cout << fitnxId << " = " << s.fitnx << "\n";
	std::cout << fitnyId << " = " << s.fitny << "\n";
	std::cout << mapTypeId << " = " << getMapTypeName(s.mapType) << "\n";

	if (s.filterType) std::cout << typeId << " = " << getTypeName(s.type) << "\n";

	if (s.filterAfter) std::cout << afterId << " = " << std::put_time(&s.aftertm, "%c") << "\n";
	if (s.filterBefore) std::cout << beforeId << " = " << std::put_time(&s.beforetm, "%c") << "\n";

	//std::cout << "s.fit = " << s.fit << "\n";
	if (!s.fit)
		printBounds(s);

	std::cout << std::endl;

	if (s.cmapFile != "" && (cmapName != "" || s.allCmaps))
	{
		int io;
		if (s.allCmaps)
		{
			io = irwincolor::loadMapNames(s.cmapFile, s.mapNames);
			//std::cout << "mapNames = " << s.mapNames << std::endl;
		}
		else
			io = s.c.load(s.cmapFile, cmapName);
		if (io != 0) return io;
	}
	return 0;
}